

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phf.cc
# Opt level: O1

int PHF::init<unsigned_int,true>(phf *phf,uint *k,size_t n,size_t l,size_t a,phf_seed_t seed)

{
  long *plVar1;
  ulong *puVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  byte bVar6;
  ulong uVar7;
  int *__base;
  void *__ptr;
  uint32_t *puVar8;
  int *piVar9;
  uint uVar10;
  ulong uVar11;
  size_t sVar12;
  long *plVar13;
  size_t sVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  size_t __nmemb;
  int *piVar18;
  uint32_t uVar19;
  int *piVar20;
  int *piVar21;
  ulong uVar22;
  ulong uVar23;
  void *local_58;
  
  uVar23 = n + (n == 0);
  uVar11 = l + (l == 0);
  sVar12 = 100;
  if (a < 100) {
    sVar12 = a;
  }
  phf->nodiv = true;
  if (uVar23 <= uVar11) {
    uVar11 = uVar23;
  }
  uVar11 = uVar23 / uVar11 - 1;
  uVar11 = uVar11 >> 1 | uVar11;
  uVar11 = uVar11 >> 2 | uVar11;
  uVar11 = uVar11 >> 4 | uVar11;
  uVar11 = uVar11 >> 8 | uVar11;
  uVar11 = uVar11 >> 0x10 | uVar11;
  uVar7 = (uVar23 * 100) / (sVar12 + (sVar12 == 0)) - 1;
  uVar7 = uVar7 >> 1 | uVar7;
  uVar7 = uVar7 >> 2 | uVar7;
  uVar7 = uVar7 >> 4 | uVar7;
  uVar7 = uVar7 >> 8 | uVar7;
  uVar7 = uVar7 >> 0x10 | uVar7;
  uVar7 = uVar7 >> 0x20 | uVar7;
  sVar12 = uVar7 + 1;
  __nmemb = (uVar11 >> 0x20 | uVar11) + 1;
  if (__nmemb == 0) {
    return 0x22;
  }
  if (sVar12 == 0) {
    return 0x22;
  }
  __base = (int *)calloc(uVar23,0x10);
  if ((__base == (int *)0x0) || (local_58 = calloc(__nmemb,8), local_58 == (void *)0x0)) {
    __ptr = (void *)0x0;
    local_58 = (void *)0x0;
  }
  else {
    if (n != 0) {
      plVar13 = (long *)(__base + 2);
      sVar14 = 0;
      do {
        uVar17 = k[sVar14];
        uVar15 = (uVar17 * -0x3361d2af >> 0x11 | uVar17 * 0x16a88000) * 0x1b873593 ^ seed;
        uVar15 = (uVar15 << 0xd | uVar15 >> 0x13) * 5 + 0xe6546b64;
        uVar15 = (uVar15 >> 0x10 ^ uVar15) * -0x7a143595;
        uVar15 = (uVar15 >> 0xd ^ uVar15) * -0x3d4d51cb;
        uVar15 = (uVar15 >> 0x10 ^ uVar15) & (int)__nmemb - 1U;
        *(uint *)(plVar13 + -1) = uVar17;
        *(uint *)((long)plVar13 + -4) = uVar15;
        plVar1 = (long *)((long)local_58 + (ulong)uVar15 * 8);
        *plVar1 = *plVar1 + 1;
        *plVar13 = (long)((long)local_58 + (ulong)uVar15 * 8);
        sVar14 = sVar14 + 1;
        plVar13 = plVar13 + 2;
      } while (n != sVar14);
    }
    qsort(__base,uVar23,0x10,phf_keycmp<unsigned_int>);
    uVar11 = uVar7 + 0x40 >> 6;
    __ptr = calloc(uVar11 * 2,8);
    if (__ptr == (void *)0x0) {
      __ptr = (void *)0x0;
    }
    else {
      puVar8 = (uint32_t *)calloc(__nmemb,4);
      if (puVar8 != (uint32_t *)0x0) {
        iVar3 = 0;
        if ((long)n < 1) {
          uVar23 = 0;
        }
        else {
          uVar17 = (int)sVar12 - 1;
          uVar23 = 0;
          piVar9 = __base;
          do {
            lVar4 = **(long **)(piVar9 + 2);
            if (lVar4 == 0) break;
            piVar18 = piVar9 + lVar4 * 4;
            uVar7 = 1;
            while (uVar19 = (uint32_t)uVar7, 0 < lVar4) {
              uVar15 = (uVar19 * -0x3361d2af >> 0x11 | uVar19 * 0x16a88000) * 0x1b873593 ^ seed;
              uVar15 = (uVar15 << 0xd | uVar15 >> 0x13) * 5 + 0xe6546b64;
              piVar20 = piVar9;
              while( true ) {
                uVar10 = ((uint)(*piVar20 * -0x3361d2af) >> 0x11 | *piVar20 * 0x16a88000) *
                         0x1b873593 ^ uVar15;
                uVar10 = (uVar10 << 0xd | uVar10 >> 0x13) * 5 + 0xe6546b64;
                uVar10 = (uVar10 >> 0x10 ^ uVar10) * -0x7a143595;
                uVar10 = (uVar10 >> 0xd ^ uVar10) * -0x3d4d51cb;
                uVar10 = (uVar10 >> 0x10 ^ uVar10) & uVar17;
                uVar16 = (ulong)(uVar10 >> 6);
                uVar22 = 1L << ((byte)uVar10 & 0x3f);
                piVar21 = piVar9;
                if (((*(ulong *)((long)__ptr + uVar16 * 8) >> ((ulong)uVar10 & 0x3f) & 1) != 0) ||
                   (uVar5 = *(ulong *)((long)__ptr + uVar16 * 8 + uVar11 * 8), (uVar5 & uVar22) != 0
                   )) break;
                *(ulong *)((long)__ptr + uVar16 * 8 + uVar11 * 8) = uVar5 | uVar22;
                piVar20 = piVar20 + 4;
                if (piVar18 <= piVar20) goto LAB_00132222;
              }
              do {
                uVar10 = ((uint)(*piVar21 * -0x3361d2af) >> 0x11 | *piVar21 * 0x16a88000) *
                         0x1b873593 ^ uVar15;
                uVar10 = (uVar10 << 0xd | uVar10 >> 0x13) * 5 + 0xe6546b64;
                uVar10 = (uVar10 >> 0x10 ^ uVar10) * -0x7a143595;
                uVar10 = (uVar10 >> 0xd ^ uVar10) * -0x3d4d51cb;
                uVar10 = (uVar10 >> 0x10 ^ uVar10) & uVar17;
                bVar6 = (byte)uVar10 & 0x3f;
                puVar2 = (ulong *)((long)__ptr + (ulong)(uVar10 >> 6) * 8 + uVar11 * 8);
                *puVar2 = *puVar2 & (-2L << bVar6 | 0xfffffffffffffffeU >> 0x40 - bVar6);
                piVar21 = piVar21 + 4;
              } while (piVar21 < piVar18);
              uVar7 = uVar7 + 1;
            }
LAB_00132222:
            if (0 < lVar4) {
              uVar15 = (uVar19 * -0x3361d2af >> 0x11 | uVar19 * 0x16a88000) * 0x1b873593 ^ seed;
              piVar20 = piVar9;
              do {
                uVar10 = ((uint)(*piVar20 * -0x3361d2af) >> 0x11 | *piVar20 * 0x16a88000) *
                         0x1b873593 ^ (uVar15 << 0xd | uVar15 >> 0x13) * 5 + 0xe6546b64;
                uVar10 = (uVar10 << 0xd | uVar10 >> 0x13) * 5 + 0xe6546b64;
                uVar10 = (uVar10 >> 0x10 ^ uVar10) * -0x7a143595;
                uVar10 = (uVar10 >> 0xd ^ uVar10) * -0x3d4d51cb;
                uVar10 = (uVar10 >> 0x10 ^ uVar10) & uVar17;
                puVar2 = (ulong *)((long)__ptr + (ulong)(uVar10 >> 6) * 8);
                *puVar2 = *puVar2 | 1L << ((byte)uVar10 & 0x3f);
                piVar20 = piVar20 + 4;
              } while (piVar20 < piVar18);
            }
            uVar23 = uVar23 & 0xffffffff;
            if (uVar23 < uVar7) {
              uVar23 = uVar7;
            }
            puVar8[(uint)piVar9[1]] = uVar19;
            piVar9 = piVar18;
          } while (piVar18 < __base + n * 4);
          uVar23 = uVar23 & 0xffffffff;
        }
        phf->seed = seed;
        phf->r = __nmemb;
        phf->m = sVar12;
        phf->g = puVar8;
        phf->d_max = uVar23;
        phf->g_op = PHF_G_UINT32_BAND_R;
        phf->g_jmp = (void *)0x0;
        goto LAB_001322fd;
      }
    }
  }
  piVar9 = __errno_location();
  iVar3 = *piVar9;
LAB_001322fd:
  free(__ptr);
  free(local_58);
  free(__base);
  return iVar3;
}

Assistant:

PHF_PUBLIC int PHF::init(struct phf *phf, const key_t k[], const size_t n, const size_t l, const size_t a, const phf_seed_t seed) {
	size_t n1 = PHF_MAX(n, 1); /* for computations that require n > 0 */
	size_t l1 = PHF_MAX(l, 1);
	size_t a1 = PHF_MAX(PHF_MIN(a, 100), 1);
	size_t r; /* number of buckets */
	size_t m; /* size of output array */
	phf_key<key_t> *B_k = NULL; /* linear bucket-slot array */
	size_t *B_z = NULL;         /* number of slots per bucket */
	phf_key<key_t> *B_p, *B_pe;
	phf_bits_t *T = NULL; /* bitmap to track index occupancy */
	phf_bits_t *T_b;      /* per-bucket working bitmap */
	size_t T_n;
	uint32_t *g = NULL; /* displacement map */
	uint32_t d_max = 0; /* maximum displacement value */
	int error;

	if ((phf->nodiv = nodiv)) {
		/* round to power-of-2 so we can use bit masks instead of modulo division */
		r = phf_powerup(n1 / PHF_MIN(l1, n1));
		m = phf_powerup((n1 * 100) / a1);
	} else {
		r = phf_primeup(PHF_HOWMANY(n1, l1));
		/* XXX: should we bother rounding m to prime number for small n? */
		m = phf_primeup((n1 * 100) / a1);
	}

	if (r == 0 || m == 0)
		return ERANGE;

	if (!(B_k = static_cast<phf_key<key_t> *>(calloc(n1, sizeof *B_k))))
		goto syerr;
	if (!(B_z = static_cast<size_t *>(calloc(r, sizeof *B_z))))
		goto syerr;

	for (size_t i = 0; i < n; i++) {
		phf_hash_t g = phf_g_mod_r<nodiv>(k[i], seed, r);

		B_k[i].k = k[i];
		B_k[i].g = g;
		B_k[i].n = &B_z[g];
		++*B_k[i].n;
	}

	qsort(B_k, n1, sizeof *B_k, reinterpret_cast<int(*)(const void *, const void *)>(&phf_keycmp<key_t>));

	T_n = PHF_HOWMANY(m, PHF_BITS(*T));
	if (!(T = static_cast<phf_bits_t *>(calloc(T_n * 2, sizeof *T))))
		goto syerr;
	T_b = &T[T_n]; /* share single allocation */

	/*
	 * FIXME: T_b[] is unnecessary. We could clear T[] the same way we
	 * clear T_b[]. In fact, at the end of generation T_b[] is identical
	 * to T[] because we don't clear T_b[] on success.
	 *
	 * We just need to tweak the current reset logic to stop before the
	 * key that failed, and then we can elide the commit to T[] at the
	 * end of the outer loop.
	 */

	if (!(g = static_cast<uint32_t *>(calloc(r, sizeof *g))))
		goto syerr;

	B_p = B_k;
	B_pe = &B_k[n];

	for (; B_p < B_pe && *B_p->n > 0; B_p += *B_p->n) {
		phf_key<key_t> *Bi_p, *Bi_pe;
		size_t d = 0;
		uint32_t f;
retry:
		d++;
		Bi_p = B_p;
		Bi_pe = B_p + *B_p->n;

		for (; Bi_p < Bi_pe; Bi_p++) {
			f = phf_f_mod_m<nodiv>(d, Bi_p->k, seed, m);

			if (phf_isset(T, f) || phf_isset(T_b, f)) {
				/* reset T_b[] */
				for (Bi_p = B_p; Bi_p < Bi_pe; Bi_p++) {
					f = phf_f_mod_m<nodiv>(d, Bi_p->k, seed, m);
					phf_clrbit(T_b, f);
				}

				goto retry;
			} else {
				phf_setbit(T_b, f);
			}
		}

		/* commit to T[] */
		for (Bi_p = B_p; Bi_p < Bi_pe; Bi_p++) {
			f = phf_f_mod_m<nodiv>(d, Bi_p->k, seed, m);
			phf_setbit(T, f);
		}

		/* commit to g[] */
		g[B_p->g] = d;
		d_max = PHF_MAX(d, d_max);
	}

	phf->seed = seed;
	phf->r = r;
	phf->m = m;

	phf->g = g;
	g = NULL;

	phf->d_max = d_max;
	phf->g_op = (nodiv)? phf::PHF_G_UINT32_BAND_R : phf::PHF_G_UINT32_MOD_R;
	phf->g_jmp = NULL;

	error = 0;

	goto clean;
syerr:
	error = errno;
clean:
	free(g);
	free(T);
	free(B_z);
	free(B_k);

	return error;
}